

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawSchema ** __thiscall
capnp::SchemaLoader::Validator::makeDependencyArray(Validator *this,uint32_t *count)

{
  NodeUnion *pNVar1;
  uint uVar2;
  Entry *pEVar3;
  NodeUnion *pNVar4;
  uint uVar5;
  ulong uVar6;
  RawSchema **ppRVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  NodeUnion *pNVar11;
  uint uVar12;
  
  uVar6 = (long)(this->dependencies).table.rows.builder.pos -
          (long)(this->dependencies).table.rows.builder.ptr;
  *count = (uint32_t)(uVar6 >> 4);
  uVar8 = 0;
  ppRVar7 = (RawSchema **)
            kj::Arena::allocateBytes(&this->loader->arena,uVar6 >> 1 & 0x7fffffff8,8,false);
  pEVar3 = (this->dependencies).table.rows.builder.ptr;
  pNVar4 = (this->dependencies).table.indexes.impl.tree;
  uVar12 = (this->dependencies).table.indexes.impl.endLeaf;
  pNVar1 = pNVar4 + uVar12;
  iVar9 = 7;
  if (pNVar4[uVar12].field_0.freelist.zero[7] == 0) {
    iVar9 = 0;
  }
  iVar9 = iVar9 + (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)(uint)(iVar9 * 4) + 0x14) != 0) *
                  4;
  uVar10 = iVar9 + (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)(uint)(iVar9 * 4) + 0xc) != 0) *
                   2;
  uVar2 = (this->dependencies).table.indexes.impl.beginLeaf;
  uVar5 = (uint)(*(int *)((long)&pNVar1->field_0 + (ulong)uVar10 * 4 + 8) == 0);
  uVar10 = uVar10 + 1;
  if ((uVar2 != uVar12) || (uVar10 != uVar5)) {
    pNVar11 = pNVar4 + uVar2;
    uVar12 = 0;
    do {
      ppRVar7[uVar8] = pEVar3[*(int *)((long)&pNVar11->field_0 + (ulong)uVar12 * 4 + 8) - 1].value;
      uVar12 = uVar12 + 1;
      if (((0xd < uVar12) || (*(int *)((long)&pNVar11->field_0 + (ulong)uVar12 * 4 + 8) == 0)) &&
         (uVar6 = (ulong)(pNVar11->field_0).leaf.next, uVar6 != 0)) {
        pNVar11 = pNVar4 + uVar6;
        uVar12 = 0;
      }
      uVar8 = uVar8 + 1;
    } while ((pNVar11 != pNVar1) || (uVar12 != uVar10 - uVar5));
  }
  return ppRVar7;
}

Assistant:

const _::RawSchema** makeDependencyArray(uint32_t* count) {
    *count = dependencies.size();
    kj::ArrayPtr<const _::RawSchema*> result =
        loader.arena.allocateArray<const _::RawSchema*>(*count);
    uint pos = 0;
    for (auto& dep: dependencies) {
      result[pos++] = dep.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }